

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O1

ErrorCode __thiscall ComponentManager::AddService(ComponentManager *this,CID cid,ISupports *service)

{
  Node *pNVar1;
  ClassInfo *pCVar2;
  Node *pNVar3;
  
  pCVar2 = (ClassInfo *)
           operator_new(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                        ,0xe0);
  (pCVar2->mCid).mId = cid.mId;
  pCVar2->mClass = service;
  (**service->_vptr_ISupports)(service);
  pNVar3 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar3->val = pCVar2;
  pNVar1 = (this->mClasses).mTail;
  pNVar3->prev = pNVar1->prev;
  pNVar3->next = pNVar1;
  pNVar1->prev->next = pNVar3;
  pNVar1->prev = pNVar3;
  return kNoError;
}

Assistant:

ErrorCode ComponentManager::AddService( CID cid, ISupports *service )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	ClassInfo *info = jh_new ClassInfo( cid, service );
	
	LOG( "Adding cid %s, ISupports %p", cid.toString(), service );
	
	service->AddRef();
	
	mClasses.push_back( info );
	
	return kNoError;
}